

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O1

bool __thiscall
libtorrent::aux::tracker_manager::incoming_packet
          (tracker_manager *this,endpoint *ep,span<const_char> buf)

{
  session_logger *psVar1;
  ulong uVar2;
  udp_tracker_connection *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar3;
  uint ret;
  int iVar4;
  uint uVar5;
  _Hash_node_base *p_Var6;
  endpoint *ep_00;
  long lVar7;
  ulong uVar8;
  endpoint *ep_01;
  uint ret_1;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  string local_48;
  
  if (buf.m_len < 8) {
    iVar4 = (**this->m_ses->_vptr_session_logger)();
    if ((char)iVar4 != '\0') {
      psVar1 = this->m_ses;
      print_endpoint_abi_cxx11_(&local_48,(aux *)ep,ep_00);
      (*psVar1->_vptr_session_logger[1])
                (psVar1,"incoming packet from %s, not a UDP tracker message (%d Bytes)",
                 local_48._M_dataplus._M_p,buf.m_len & 0xffffffff);
LAB_0037e599:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    uVar5 = 0;
    lVar7 = 0;
    do {
      uVar5 = uVar5 << 8 | (uint)(byte)buf.m_ptr[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    uVar8 = 0;
    if (3 < uVar5) goto LAB_0037e6c3;
    lVar7 = 4;
    do {
      uVar5 = (int)uVar8 << 8 | (uint)(byte)buf.m_ptr[lVar7];
      uVar8 = (ulong)uVar5;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 8);
    uVar2 = (this->m_udp_conns)._M_h._M_bucket_count;
    uVar8 = uVar8 % uVar2;
    p_Var9 = (this->m_udp_conns)._M_h._M_buckets[uVar8];
    p_Var10 = (__node_base_ptr)0x0;
    if ((p_Var9 != (__node_base_ptr)0x0) &&
       (p_Var6 = p_Var9->_M_nxt, p_Var10 = p_Var9, uVar5 != *(uint *)&p_Var9->_M_nxt[1]._M_nxt)) {
      while (p_Var9 = p_Var6, p_Var6 = p_Var9->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
        p_Var10 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var6[1]._M_nxt % uVar2 != uVar8) ||
           (p_Var10 = p_Var9, uVar5 == *(uint *)&p_Var6[1]._M_nxt)) goto LAB_0037e64f;
      }
      p_Var10 = (__node_base_ptr)0x0;
    }
LAB_0037e64f:
    if (p_Var10 == (__node_base_ptr)0x0) {
      p_Var6 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var6 = p_Var10->_M_nxt;
    }
    if (p_Var6 != (_Hash_node_base *)0x0) {
      this_00 = (udp_tracker_connection *)p_Var6[2]._M_nxt;
      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6[3]._M_nxt;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      bVar3 = udp_tracker_connection::on_receive(this_00,ep,buf);
      uVar8 = (ulong)bVar3;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      goto LAB_0037e6c3;
    }
    iVar4 = (**this->m_ses->_vptr_session_logger)();
    if ((char)iVar4 != '\0') {
      psVar1 = this->m_ses;
      print_endpoint_abi_cxx11_(&local_48,(aux *)ep,ep_01);
      (*psVar1->_vptr_session_logger[1])
                (psVar1,"incoming UDP tracker packet from %s has invalid transaction ID (%x)",
                 local_48._M_dataplus._M_p,(ulong)uVar5);
      goto LAB_0037e599;
    }
  }
  uVar8 = 0;
LAB_0037e6c3:
  return SUB81(uVar8,0);
}

Assistant:

bool tracker_manager::incoming_packet(udp::endpoint const& ep
		, span<char const> const buf)
	{
		TORRENT_ASSERT(is_single_thread());
		// ignore packets smaller than 8 bytes
		if (buf.size() < 8)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (m_ses.should_log())
			{
				m_ses.session_log("incoming packet from %s, not a UDP tracker message "
					"(%d Bytes)", print_endpoint(ep).c_str(), int(buf.size()));
			}
#endif
			return false;
		}

		// the first word is the action, if it's not [0, 3]
		// it's not a valid udp tracker response
		span<const char> ptr = buf;
		std::uint32_t const action = aux::read_uint32(ptr);
		if (action > 3) return false;

		std::uint32_t const transaction = aux::read_uint32(ptr);
		auto const i = m_udp_conns.find(transaction);

		if (i == m_udp_conns.end())
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (m_ses.should_log())
			{
				m_ses.session_log("incoming UDP tracker packet from %s has invalid "
					"transaction ID (%x)", print_endpoint(ep).c_str()
					, transaction);
			}
#endif
			return false;
		}

		auto const p = i->second;
		// on_receive() may remove the tracker connection from the list
		return p->on_receive(ep, buf);
	}